

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O2

ssize_t __thiscall testbench::memory::read(memory *this,int __fd,void *__buf,size_t __nbytes)

{
  __shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong unaff_RBP;
  __shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<testbench::address_range> range;
  __shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var5 = &((this->ranges).
             super__Vector_base<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>;
  p_Var1 = &((this->ranges).
             super__Vector_base<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (p_Var5 == p_Var1) {
      unaff_RBP = 0;
      break;
    }
    std::__shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var5);
    iVar3 = (*(local_40._M_ptr)->_vptr_address_range[1])();
    bVar2 = true;
    if (((char)iVar3 != '\0') &&
       (iVar3 = (*(local_40._M_ptr)->_vptr_address_range[2])(local_40._M_ptr,__fd),
       (char)iVar3 != '\0')) {
      uVar4 = (*(local_40._M_ptr)->_vptr_address_range[3])(local_40._M_ptr,__fd);
      unaff_RBP = (ulong)uVar4;
      bVar2 = false;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    p_Var5 = p_Var5 + 1;
  } while (bVar2);
  return unaff_RBP & 0xffffffff;
}

Assistant:

unsigned char memory::read(unsigned address) const noexcept
{
    for (auto range : ranges) {
        if (range->is_visible() and range->contains(address)) {
            return range->read(address);
        }
    }
    return 0;
}